

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtpudpv6transmitter.h
# Opt level: O2

void __thiscall
jrtplib::RTPUDPv6TransmissionInfo::~RTPUDPv6TransmissionInfo(RTPUDPv6TransmissionInfo *this)

{
  (this->super_RTPTransmissionInfo)._vptr_RTPTransmissionInfo =
       (_func_int **)&PTR__RTPUDPv6TransmissionInfo_00145428;
  std::__cxx11::_List_base<in6_addr,_std::allocator<in6_addr>_>::_M_clear
            (&(this->localIPlist).super__List_base<in6_addr,_std::allocator<in6_addr>_>);
  return;
}

Assistant:

~RTPUDPv6TransmissionInfo()								{ }